

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameDoesNotExist::Run(void)

{
  bool bVar1;
  allocator local_31;
  FlagSaver fs;
  string value;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineOptionTest","NameDoesNotExist");
  std::__cxx11::string::string((string *)&value,"will not be changed",&local_31);
  bVar1 = GetCommandLineOption("test_int3210",&value);
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(r)");
  }
  else {
    bVar1 = std::operator==("will not be changed",&value);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&value);
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","\"will not be changed\"","==","value");
  }
  exit(1);
}

Assistant:

TEST(GetCommandLineOptionTest, NameDoesNotExist) {
  string value("will not be changed");
  const bool r = GetCommandLineOption("test_int3210", &value);
  EXPECT_FALSE(r);
  EXPECT_EQ("will not be changed", value);
}